

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O1

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  long *arg1;
  undefined1 auVar1 [8];
  Iterator *this;
  void *arg2;
  Block *this_00;
  Status s;
  BlockContents contents;
  char cache_key_buffer [16];
  BlockHandle handle;
  Slice key;
  Slice input;
  undefined1 local_90 [8];
  char *local_88;
  BlockContents local_80;
  char *local_68;
  undefined8 local_60;
  Slice local_58;
  char **local_48;
  undefined8 local_40;
  char *local_38;
  size_t sStack_30;
  
  arg1 = *(long **)(*arg + 0x30);
  local_58.data_._0_4_ = 0xffffffff;
  local_58.data_._4_4_ = 0xffffffff;
  local_58.size_._0_4_ = 0xffffffff;
  local_58.size_._4_4_ = 0xffffffff;
  local_38 = index_value->data_;
  sStack_30 = index_value->size_;
  BlockHandle::DecodeFrom((BlockHandle *)local_90,&local_58);
  if (local_90 == (undefined1  [8])0x0) {
    local_80.data.data_ = "";
    local_80.data.size_ = 0;
    if (arg1 == (long *)0x0) {
      ReadBlock((leveldb *)&local_68,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)&local_58,&local_80);
      auVar1 = local_90;
      local_90 = (undefined1  [8])local_68;
      local_68 = (char *)auVar1;
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete__((void *)auVar1);
      }
      if (local_90 != (undefined1  [8])0x0) goto LAB_0011f445;
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_80);
    }
    else {
      local_68 = *(char **)(*arg + 0x70);
      local_48 = &local_68;
      local_60 = CONCAT44(local_58.data_._4_4_,local_58.data_._0_4_);
      local_40 = 0x10;
      arg2 = (void *)(**(code **)(*arg1 + 0x18))(arg1);
      if (arg2 != (void *)0x0) {
        this_00 = (Block *)(**(code **)(*arg1 + 0x28))(arg1,arg2);
        goto LAB_0011f44b;
      }
      ReadBlock((leveldb *)&local_88,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)&local_58,&local_80);
      auVar1 = local_90;
      local_90 = (undefined1  [8])local_88;
      local_88 = (char *)auVar1;
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete__((void *)auVar1);
      }
      if (local_90 != (undefined1  [8])0x0) goto LAB_0011f445;
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,&local_80);
      if ((local_80.cachable == true) && (options->fill_cache == true)) {
        arg2 = (void *)(**(code **)(*arg1 + 0x10))
                                 (arg1,&local_48,this_00,this_00->size_,DeleteCachedBlock);
        goto LAB_0011f44b;
      }
    }
  }
  else {
LAB_0011f445:
    this_00 = (Block *)0x0;
  }
  arg2 = (void *)0x0;
LAB_0011f44b:
  if (this_00 == (Block *)0x0) {
    this = NewErrorIterator((Status *)local_90);
  }
  else {
    this = Block::NewIterator(this_00,(Comparator *)**arg);
    if (arg2 == (void *)0x0) {
      Iterator::RegisterCleanup(this,DeleteBlock,this_00,(void *)0x0);
    }
    else {
      Iterator::RegisterCleanup(this,ReleaseBlock,arg1,arg2);
    }
  }
  if (local_90 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_90);
  }
  return this;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}